

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.h
# Opt level: O2

string * __thiscall
wallet::BerkeleyRODatabase::Filename_abi_cxx11_
          (string *__return_storage_ptr__,BerkeleyRODatabase *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::filesystem::__cxx11::path::string(__return_storage_ptr__,&(this->m_filepath).super_path);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Filename() override { return fs::PathToString(m_filepath); }